

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

int stbtt__tesselate_curve
              (stbtt__point *points,int *num_points,float x0,float y0,float x1,float y1,float x2,
              float y2,float objspace_flatness_squared,int n)

{
  float in_EDX;
  stbtt__point *in_RSI;
  stbtt__point *in_RDI;
  float in_XMM0_Da;
  float objspace_flatness_squared_00;
  float n_00;
  float fVar1;
  float fVar2;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float dy;
  float dx;
  float my;
  float mx;
  
  objspace_flatness_squared_00 = (in_XMM2_Da + in_XMM2_Da + in_XMM0_Da + in_XMM4_Da) / 4.0;
  n_00 = (in_XMM3_Da + in_XMM3_Da + in_XMM1_Da + in_XMM5_Da) / 4.0;
  fVar1 = (in_XMM0_Da + in_XMM4_Da) / 2.0 - objspace_flatness_squared_00;
  fVar2 = (in_XMM1_Da + in_XMM5_Da) / 2.0 - n_00;
  if ((int)in_EDX < 0x11) {
    if (fVar1 * fVar1 + fVar2 * fVar2 <= in_XMM6_Da) {
      stbtt__add_point(in_RDI,(int)in_RSI->x,in_XMM4_Da,in_XMM5_Da);
      in_RSI->x = (float)((int)in_RSI->x + 1);
    }
    else {
      stbtt__tesselate_curve
                (in_RSI,(int *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,
                 in_XMM5_Da,in_XMM6_Da,in_EDX,objspace_flatness_squared_00,(int)n_00);
      stbtt__tesselate_curve
                (in_RSI,(int *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da,in_XMM4_Da,
                 in_XMM5_Da,in_XMM6_Da,in_EDX,objspace_flatness_squared_00,(int)n_00);
    }
  }
  return 1;
}

Assistant:

static int stbtt__tesselate_curve(stbtt__point *points, int *num_points, float x0, float y0, float x1, float y1, float x2, float y2, float objspace_flatness_squared, int n)
{
   // midpoint
   float mx = (x0 + 2*x1 + x2)/4;
   float my = (y0 + 2*y1 + y2)/4;
   // versus directly drawn line
   float dx = (x0+x2)/2 - mx;
   float dy = (y0+y2)/2 - my;
   if (n > 16) // 65536 segments on one curve better be enough!
      return 1;
   if (dx*dx+dy*dy > objspace_flatness_squared) { // half-pixel error allowed... need to be smaller if AA
      stbtt__tesselate_curve(points, num_points, x0,y0, (x0+x1)/2.0f,(y0+y1)/2.0f, mx,my, objspace_flatness_squared,n+1);
      stbtt__tesselate_curve(points, num_points, mx,my, (x1+x2)/2.0f,(y1+y2)/2.0f, x2,y2, objspace_flatness_squared,n+1);
   } else {
      stbtt__add_point(points, *num_points,x2,y2);
      *num_points = *num_points+1;
   }
   return 1;
}